

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::ignore_case(string *__return_storage_ptr__,string *item)

{
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,item);
  detail::to_lower(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ignore_case(std::string item) { return detail::to_lower(item); }